

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall
nn::ESoinn::findMergedClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *mergeClasses)

{
  vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *this_00;
  double maxDensity;
  double dVar1;
  uint32_t uVar2;
  pointer pEVar3;
  ConcreteLogger *this_01;
  pointer puVar4;
  const_reference pvVar5;
  mapped_type *pmVar6;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *p_Var7;
  uint uVar8;
  ulong __n;
  ESoinn *pEVar9;
  undefined1 auVar10 [8];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 local_90 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> neighbours;
  uint local_40;
  uint local_3c;
  uint32_t num;
  uint32_t A_axes;
  uint32_t B_axes;
  
  this_01 = log_netw;
  std::__cxx11::string::string((string *)local_90,"findMergedClasses function",(allocator *)&A_axes)
  ;
  uVar8 = 0;
  logger::ConcreteLogger::debug(this_01,(string *)local_90,false);
  std::__cxx11::string::~string((string *)local_90);
  this_00 = &this->m_Neurons;
  do {
    __n = (ulong)uVar8;
    pEVar3 = (this->m_Neurons).
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_Neurons).
                       super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3) / 0x88) <= __n) {
      return;
    }
    A_axes = uVar8;
    if (pEVar3[__n].m_IsDeleted == false) {
      pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                         (this_00,__n);
      neuron::ESoinnNeuron::getNeighbours
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,pvVar5);
      puVar4 = neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (auVar10 = local_90; auVar10 != (undefined1  [8])puVar4;
          auVar10 = (undefined1  [8])((long)auVar10 + 4)) {
        local_40 = *(uint *)auVar10;
        if (A_axes < local_40) {
          pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                             (this_00,(ulong)A_axes);
          uVar2 = pvVar5->m_CurClass;
          pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                             (this_00,(ulong)local_40);
          if (uVar2 != pvVar5->m_CurClass) {
            pmVar6 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::at(node_axis,&A_axes);
            local_3c = *pmVar6;
            pmVar6 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::at(node_axis,&local_40);
            num = *pmVar6;
            if (local_3c == num) {
              __assert_fail("A_axes != B_axes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/neural_network/ESoinn.cpp"
                            ,0x16e,
                            "void nn::ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t> &, std::map<uint32_t, std::set<uint32_t>> &) const"
                           );
            }
            pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (this_00,(ulong)local_3c);
            dVar12 = pvVar5->m_Density;
            pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (this_00,(ulong)num);
            maxDensity = pvVar5->m_Density;
            pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (this_00,(ulong)A_axes);
            dVar1 = pvVar5->m_Density;
            pvVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (this_00,(ulong)local_40);
            dVar13 = pvVar5->m_Density;
            pEVar9 = this;
            dVar11 = meanDensity(this,local_3c);
            dVar11 = getAlpha(pEVar9,dVar12,dVar11);
            if (dVar1 <= dVar13) {
              dVar13 = dVar1;
            }
            if (dVar13 <= dVar12 * dVar11) {
              pEVar9 = this;
              dVar12 = meanDensity(this,num);
              dVar12 = getAlpha(pEVar9,maxDensity,dVar12);
              if (dVar13 <= maxDensity * dVar12) goto LAB_0013ac0d;
            }
            p_Var7 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)std::
                        map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator[](mergeClasses,&local_3c);
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_emplace_unique<unsigned_int_const&>(p_Var7,&num);
            p_Var7 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)std::
                        map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator[](mergeClasses,&num);
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_emplace_unique<unsigned_int_const&>(p_Var7,&local_3c);
          }
        }
LAB_0013ac0d:
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    }
    uVar8 = A_axes + 1;
  } while( true );
}

Assistant:

void ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t>& node_axis, std::map<uint32_t, std::set<uint32_t>>& mergeClasses) const
    {
        log_netw->debug("findMergedClasses function");
        //iterate all edges
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            std::vector<uint32_t> neighbours = m_Neurons.at(i).getNeighbours();
            for (uint32_t num: neighbours)
            {
                if (num <= i)
                    continue;
                
                if (m_Neurons.at(i).curClass() != m_Neurons.at(num).curClass())
                {
                    const uint32_t A_axes = node_axis.at(i);
                    const uint32_t B_axes = node_axis.at(num);
                    assert(A_axes != B_axes);
                        
                    const double Amax = m_Neurons.at(A_axes).density();
                    const double Bmax = m_Neurons.at(B_axes).density();
                    const double min_density = std::min(m_Neurons.at(i).density(), m_Neurons.at(num).density());
                    if (min_density > getAlpha(Amax, meanDensity(A_axes)) * Amax ||
                        min_density > getAlpha(Bmax, meanDensity(B_axes)) * Bmax)
                    {
                        //Add two classes as need to merge 
                        mergeClasses[A_axes].emplace(B_axes);
                        mergeClasses[B_axes].emplace(A_axes);
                    }
                }
            }
        }
    }